

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

torrent_peer * __thiscall
libtorrent::peer_list::add_peer
          (peer_list *this,endpoint *remote,peer_source_flags_t src,pex_flags_t flags,
          torrent_state *state)

{
  ushort uVar1;
  torrent_peer *p;
  anon_enum_32 aVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined1 auVar5 [16];
  match_peer_endpoint __pred;
  address remote_address;
  pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
  range;
  address local_150;
  _Map_pointer local_130;
  _Elt_pointer local_128;
  _Elt_pointer pptStack_120;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_118;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined8 local_e8;
  _Map_pointer ppptStack_e0;
  _Elt_pointer local_d8;
  _Elt_pointer pptStack_d0;
  _Elt_pointer local_c8;
  _Map_pointer ppptStack_c0;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_b8;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_98;
  iterator local_70;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Elt_pointer pptStack_40;
  _Map_pointer local_38;
  ipv4_peer *this_00;
  
  if ((remote->impl_).data_.base.sa_family == 2) {
    local_150.ipv4_address_.addr_.s_addr = (in4_addr_type)(remote->impl_).data_.v6.sin6_flowinfo;
    local_150.ipv6_address_.addr_.__in6_u = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
    local_150.ipv6_address_.scope_id_ = 0;
    local_150.type_ = ipv4;
    if (local_150.ipv4_address_.addr_.s_addr == 0) {
      return (torrent_peer *)0x0;
    }
    if ((remote->impl_).data_.v4.sin_port == 0) {
      return (torrent_peer *)0x0;
    }
  }
  else {
    local_150.ipv6_address_.addr_.__in6_u =
         *(anon_union_16_3_a3f0114d_for___in6_u *)
          ((anon_union_16_3_a3f0114d_for___in6_u *)((long)&(remote->impl_).data_ + 8))->__u6_addr8;
    local_150.ipv6_address_.scope_id_ = (unsigned_long)(remote->impl_).data_.v6.sin6_scope_id;
    local_150.type_ = ipv6;
    local_150.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    if ((remote->impl_).data_.v4.sin_port == 0) {
      return (torrent_peer *)0x0;
    }
  }
  if (state->allow_multiple_connections_per_ip == true) {
    find_peers((pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
                *)local_f8,this,&local_150);
    local_98._M_cur = (_Elt_pointer)local_f8;
    local_98._M_first = uStack_f0;
    local_98._M_last = local_e8;
    local_98._M_node = ppptStack_e0;
    local_b8._M_cur = local_d8;
    local_b8._M_first = pptStack_d0;
    local_b8._M_last = local_c8;
    local_b8._M_node = ppptStack_c0;
    uVar1 = (remote->impl_).data_.v4.sin_port;
    __pred.m_port = uVar1 << 8 | uVar1 >> 8;
    __pred.m_addr = &local_150;
    __pred._10_6_ = 0;
    std::
    find_if<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
              (&local_118,&local_98,&local_b8,__pred);
    local_50 = local_118._M_cur;
    if (local_118._M_cur != local_d8) goto LAB_0023a869;
    local_128 = local_118._M_first;
    pptStack_120 = local_118._M_last;
    local_130 = local_118._M_node;
  }
  else {
    local_f8 = (undefined1  [8])
               (this->m_peers).
               super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
               super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uStack_f0 = (this->m_peers).
                super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_e8 = (this->m_peers).
               super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
               super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppptStack_e0 = (this->m_peers).
                   super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_118._M_cur =
         (this->m_peers).
         super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_118._M_first =
         (this->m_peers).
         super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_first;
    local_118._M_last =
         (this->m_peers).
         super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_last;
    local_118._M_node =
         (this->m_peers).
         super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    __lower_bound<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,boost::asio::ip::address,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::peer_address_compare>>
              (&local_50,local_f8,&local_118,&local_150);
    local_128 = local_48;
    pptStack_120 = pptStack_40;
    local_130 = local_38;
    if (local_50 !=
        (this->m_peers).
        super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
        super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur) {
      torrent_peer::address(*local_50);
      if (local_f8._0_4_ == local_150.type_) {
        if (local_f8._0_4_ == ipv6) {
          auVar5[0] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[0] == (uint8_t)uStack_f0);
          auVar5[1] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[1] == uStack_f0._1_1_);
          auVar5[2] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[2] == uStack_f0._2_1_);
          auVar5[3] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[3] == uStack_f0._3_1_);
          auVar5[4] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[4] == uStack_f0._4_1_);
          auVar5[5] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[5] == uStack_f0._5_1_);
          auVar5[6] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[6] == uStack_f0._6_1_);
          auVar5[7] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[7] == uStack_f0._7_1_);
          auVar5[8] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[8] == (uint8_t)local_e8);
          auVar5[9] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[9] == local_e8._1_1_);
          auVar5[10] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[10] == local_e8._2_1_);
          auVar5[0xb] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[0xb] == local_e8._3_1_);
          auVar5[0xc] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] == local_e8._4_1_);
          auVar5[0xd] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] == local_e8._5_1_);
          auVar5[0xe] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] == local_e8._6_1_);
          auVar5[0xf] = -(local_150.ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] == local_e8._7_1_);
          if (((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff) &&
             (ppptStack_e0 == (_Map_pointer)local_150.ipv6_address_.scope_id_)) {
LAB_0023a869:
            p = *local_50;
            update_peer(this,p,src,flags,remote);
            state->first_time_seen = false;
            return p;
          }
        }
        else if ((in4_addr_type)local_f8._4_4_ == local_150.ipv4_address_.addr_.s_addr)
        goto LAB_0023a869;
      }
      else {
      }
    }
  }
  aVar2 = local_150.type_;
  iVar4 = (**this->m_peer_allocator->_vptr_torrent_peer_allocator_interface)
                    (this->m_peer_allocator,(ulong)(local_150.type_ == ipv6));
  this_00 = (ipv4_peer *)CONCAT44(extraout_var,iVar4);
  if (this_00 != (ipv4_peer *)0x0) {
    if (aVar2 == ipv6) {
      ipv6_peer::ipv6_peer((ipv6_peer *)this_00,remote,true,src);
    }
    else {
      ipv4_peer::ipv4_peer(this_00,remote,true,src);
    }
    local_70._M_first = local_128;
    local_70._M_last = pptStack_120;
    local_70._M_node = local_130;
    bVar3 = insert_peer(this,(torrent_peer *)this_00,&local_70,flags,state);
    if (bVar3) {
      state->first_time_seen = true;
      return &this_00->super_torrent_peer;
    }
    (*this->m_peer_allocator->_vptr_torrent_peer_allocator_interface[1])
              (this->m_peer_allocator,this_00);
  }
  return (torrent_peer *)0x0;
}

Assistant:

torrent_peer* peer_list::add_peer(tcp::endpoint const& remote
		, peer_source_flags_t const src, pex_flags_t const flags
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto const remote_address = remote.address();

		// just ignore the obviously invalid entries
		if (remote_address == address() || remote.port() == 0)
			return nullptr;

		// don't allow link-local IPv6 addresses since they
		// can't be used like normal addresses, they require an interface
		// and will just cause connect() to fail with EINVAL
		if (remote_address.is_v6() && remote_address.to_v6().is_link_local())
			return nullptr;

		iterator iter;
		torrent_peer* p = nullptr;

		bool found = false;
		if (state->allow_multiple_connections_per_ip)
		{
			auto const range = find_peers(remote_address);
			iter = std::find_if(range.first, range.second
				, match_peer_endpoint(remote_address, remote.port()));
			if (iter != range.second) found = true;
		}
		else
		{
			iter = std::lower_bound(m_peers.begin(), m_peers.end()
				, remote_address, peer_address_compare());

			if (iter != m_peers.end() && (*iter)->address() == remote_address) found = true;
		}

		if (!found)
		{
			// we don't have any info about this peer.
			// add a new entry

			bool const is_v6 = remote_address.is_v6();
			p = m_peer_allocator.allocate_peer_entry(
				is_v6 ? torrent_peer_allocator_interface::ipv6_peer_type
				: torrent_peer_allocator_interface::ipv4_peer_type);
			if (p == nullptr) return nullptr;

			if (is_v6)
				p = new (p) ipv6_peer(remote, true, src);
			else
				p = new (p) ipv4_peer(remote, true, src);

			try
			{
				if (!insert_peer(p, iter, flags, state))
				{
					m_peer_allocator.free_peer_entry(p);
					return nullptr;
				}
			}
			catch (std::exception const&)
			{
				m_peer_allocator.free_peer_entry(p);
				return nullptr;
			}
			state->first_time_seen = true;
		}
		else
		{
			p = *iter;
			TORRENT_ASSERT(p->in_use);
			update_peer(p, src, flags, remote);
			state->first_time_seen = false;
		}

		return p;
	}